

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * Lowerer::GetMissingItemOpnd(IRType type,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *func_local;
  AddrOpnd *pAStack_10;
  IRType type_local;
  
  if (type == TyVar) {
    pAStack_10 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,func,true,(Var)0x0
                                  );
  }
  else {
    if (type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4931,"(false)",
                         "Only expecting TyVar and TyInt32 in Lowerer::GetMissingItemOpnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pAStack_10 = (AddrOpnd *)IR::IntConstOpnd::New(-0x7fffe,TyInt32,func,true);
  }
  return &pAStack_10->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GetMissingItemOpnd(IRType type, Func *func)
{
    if (type == TyVar)
    {
        return IR::AddrOpnd::New(Js::JavascriptArray::MissingItem, IR::AddrOpndKindConstantAddress, func, true);
    }
    if (type == TyInt32)
    {
        return IR::IntConstOpnd::New(Js::JavascriptNativeIntArray::MissingItem, TyInt32, func, true);
    }
    AssertMsg(false, "Only expecting TyVar and TyInt32 in Lowerer::GetMissingItemOpnd");
    __assume(false);
}